

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environ.cpp
# Opt level: O3

BOOL FreeEnvironmentStringsA(LPSTR lpValue)

{
  if (PAL_InitializeChakraCoreCalled) {
    if (lpValue != (LPSTR)0x0) {
      PAL_free(lpValue);
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
      return 1;
    }
  }
  abort();
}

Assistant:

BOOL
PALAPI
FreeEnvironmentStringsA(
            IN LPSTR lpValue)
{
    PERF_ENTRY(FreeEnvironmentStringsA);
    ENTRY("FreeEnvironmentStringsA(lpValue=%p (%s))\n", lpValue?lpValue:"NULL", lpValue?lpValue:"NULL");

    if (lpValue != NULL)
    {
        PAL_free(lpValue);
    }

    LOGEXIT("FreeEnvironmentStringA returning BOOL TRUE\n");
    PERF_EXIT(FreeEnvironmentStringsA);
    return TRUE ;
}